

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::anon_unknown_0::NegativePartialUpdateTest::init
          (NegativePartialUpdateTest *this,EVP_PKEY_CTX *ctx)

{
  NativeDisplay *pNVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int extraout_EAX;
  Library *egl;
  EGLDisplay pvVar5;
  EGLConfig pvVar6;
  undefined4 extraout_var;
  NativeWindowFactory *pNVar7;
  undefined4 extraout_var_00;
  EGLSurface pvVar8;
  undefined4 extraout_var_01;
  TestError *this_00;
  pointer_____offset_0x10___ *ppuVar9;
  allocator<char> local_59;
  EGLint pbufferAttribList [5];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar5 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pbufferAttribList,"EGL_KHR_partial_update",&local_59);
  bVar2 = eglu::hasExtension(egl,pvVar5,(string *)pbufferAttribList);
  std::__cxx11::string::~string((string *)pbufferAttribList);
  if (bVar2) {
    pvVar6 = getEGLConfig(egl,this->m_eglDisplay,this->m_surfaceType,this->m_preserveBuffer);
    this->m_eglConfig = pvVar6;
    if (this->m_surfaceType == SURFACETYPE_PBUFFER) {
      pbufferAttribList[0] = 0x3057;
      pbufferAttribList[1] = 0x1e0;
      pbufferAttribList[2] = 0x3056;
      pbufferAttribList[3] = 0x1e0;
      pbufferAttribList[4] = 0x3038;
      iVar3 = (*egl->_vptr_Library[10])(egl,this->m_eglDisplay,pvVar6);
      pvVar8 = (EGLSurface)CONCAT44(extraout_var,iVar3);
    }
    else {
      pNVar7 = eglu::selectNativeWindowFactory
                         (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                          m_cmdLine);
      pvVar5 = this->m_eglDisplay;
      pNVar1 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
               super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.
               m_data.ptr;
      pvVar6 = this->m_eglConfig;
      pbufferAttribList[2] =
           eglu::parseWindowVisibility
                     (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
      pbufferAttribList[0] = 0x1e0;
      pbufferAttribList[1] = 0x1e0;
      iVar3 = (*(pNVar7->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                        (pNVar7,pNVar1,pvVar5,pvVar6);
      this->m_window = (NativeWindow *)CONCAT44(extraout_var_00,iVar3);
      pvVar8 = eglu::createWindowSurface
                         ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                          super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                          .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var_00,iVar3),
                          this->m_eglDisplay,this->m_eglConfig,(EGLAttrib *)0x0);
    }
    this->m_eglSurface = pvVar8;
    pvVar5 = this->m_eglDisplay;
    pvVar6 = this->m_eglConfig;
    (**egl->_vptr_Library)(egl,0x30a0);
    iVar3 = (*egl->_vptr_Library[6])(egl,pvVar5,pvVar6,0,init::contextAttribList);
    dVar4 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar4,"eglCreateContext",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x7c);
    if (pvVar8 != (EGLSurface)0x0) {
      (*egl->_vptr_Library[0x27])
                (egl,pvVar5,pvVar8,pvVar8,(EGLContext)CONCAT44(extraout_var_01,iVar3));
      dVar4 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar4,"eglMakeCurrent",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                       ,0x7f);
      this->m_eglContext = (EGLContext)CONCAT44(extraout_var_01,iVar3);
      return extraout_EAX;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"eglSurface != EGL_NO_SURFACE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
               ,0x7d);
    ppuVar9 = &tcu::TestError::typeinfo;
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"EGL_KHR_partial_update is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
               ,0x9e);
    ppuVar9 = &tcu::NotSupportedError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar9,tcu::Exception::~Exception);
}

Assistant:

void NegativePartialUpdateTest::init (void)
{
	const Library&		egl						= m_eglTestCtx.getLibrary();
	static const EGLint	contextAttribList[]		= { EGL_CONTEXT_CLIENT_VERSION, 2,	EGL_NONE };
	const int			width					= 480;
	const int			height					= 480;

	m_eglDisplay = getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

	if (!hasExtension(egl, m_eglDisplay, "EGL_KHR_partial_update"))
		TCU_THROW(NotSupportedError, "EGL_KHR_partial_update is not supported");

	m_eglConfig = getEGLConfig(egl, m_eglDisplay, m_surfaceType, m_preserveBuffer);

	if (m_surfaceType == SURFACETYPE_PBUFFER)
	{
		const EGLint pbufferAttribList[] = { EGL_WIDTH, width, EGL_HEIGHT, height, EGL_NONE };
		m_eglSurface = egl.createPbufferSurface(m_eglDisplay, m_eglConfig, pbufferAttribList);
	}
	else
	{
		const NativeWindowFactory&	factory	= selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
		m_window = factory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_eglDisplay, m_eglConfig, DE_NULL,
										WindowParams(width, height, parseWindowVisibility(m_testCtx.getCommandLine())));
		m_eglSurface = createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_window, m_eglDisplay, m_eglConfig, DE_NULL);
	}
	m_eglContext = initAndMakeCurrentEGLContext(egl, m_eglDisplay, m_eglSurface, m_eglConfig, contextAttribList);
}